

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# two_level_iterator.cc
# Opt level: O2

Iterator *
leveldb::NewTwoLevelIterator
          (Iterator *index_iter,BlockFunction block_function,void *arg,ReadOptions *options)

{
  long lVar1;
  Snapshot *pSVar2;
  Iterator *this;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = (Iterator *)operator_new(0xb0);
  Iterator::Iterator(this);
  this->_vptr_Iterator = (_func_int **)&PTR__TwoLevelIterator_01148990;
  this[1]._vptr_Iterator = (_func_int **)block_function;
  this[1].cleanup_head_.function = (CleanupFunction)arg;
  pSVar2 = options->snapshot;
  this[1].cleanup_head_.arg1 = *(void **)options;
  this[1].cleanup_head_.arg2 = pSVar2;
  this[1].cleanup_head_.next = (CleanupNode *)0x0;
  IteratorWrapper::IteratorWrapper((IteratorWrapper *)(this + 2),index_iter);
  IteratorWrapper::IteratorWrapper((IteratorWrapper *)&this[2].cleanup_head_.next,(Iterator *)0x0);
  this[3].cleanup_head_.arg2 = this + 4;
  this[3].cleanup_head_.next = (CleanupNode *)0x0;
  *(undefined1 *)&this[4]._vptr_Iterator = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

Iterator* NewTwoLevelIterator(Iterator* index_iter,
                              BlockFunction block_function, void* arg,
                              const ReadOptions& options) {
  return new TwoLevelIterator(index_iter, block_function, arg, options);
}